

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_beam.cpp
# Opt level: O1

bool __thiscall
ON_Extrusion::Split(ON_Extrusion *this,int dir,double c,ON_Surface **west_or_south_side,
                   ON_Surface **east_or_north_side)

{
  double dVar1;
  double x;
  bool bVar2;
  bool bVar3;
  int iVar4;
  double *pdVar5;
  ON_Extrusion *this_00;
  ON_Curve *pOVar6;
  undefined4 uVar7;
  ON_Line right_path;
  ON_Line left_path;
  ON_Interval domain;
  ON_Interval right_t;
  ON_Interval left_t;
  ON_Interval right_domain;
  ON_Interval left_domain;
  ON_3dPoint P;
  ON_Extrusion *local_120;
  ON_Line local_108;
  double local_d8;
  double local_d0;
  ON_Line local_c8;
  ON_Interval local_98;
  ON_Interval local_88;
  ON_Interval local_78;
  ON_Interval local_68;
  ON_Interval local_58;
  ON_3dPoint local_48;
  
  if (1 < (uint)dir) {
    return false;
  }
  bVar2 = ON_IsValid(c);
  if (!bVar2) {
    return false;
  }
  if ((*west_or_south_side != (ON_Surface *)0x0) && (*west_or_south_side == *east_or_north_side)) {
    return false;
  }
  (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])(this);
  local_d0 = ON_Interval::NormalizedParameterAt(&local_98,c);
  if (local_d0 <= 0.0) {
    return false;
  }
  if (1.0 <= local_d0) {
    return false;
  }
  pdVar5 = ON_Interval::operator[](&local_98,0);
  if (c <= *pdVar5) {
    return false;
  }
  pdVar5 = ON_Interval::operator[](&local_98,1);
  if (*pdVar5 <= c) {
    return false;
  }
  this_00 = (ON_Extrusion *)*west_or_south_side;
  if (this_00 == (ON_Extrusion *)0x0) {
    this_00 = (ON_Extrusion *)0x0;
  }
  else {
    bVar2 = ON_Object::IsKindOf((ON_Object *)this_00,&m_ON_Extrusion_class_rtti);
    if (!bVar2) {
      this_00 = (ON_Extrusion *)0x0;
    }
    if (this_00 == (ON_Extrusion *)0x0) {
      return false;
    }
  }
  local_120 = (ON_Extrusion *)*east_or_north_side;
  uVar7 = SUB84(c,0);
  if (local_120 == (ON_Extrusion *)0x0) {
    local_120 = (ON_Extrusion *)0x0;
  }
  else {
    bVar2 = ON_Object::IsKindOf((ON_Object *)local_120,&m_ON_Extrusion_class_rtti);
    if (!bVar2) {
      local_120 = (ON_Extrusion *)0x0;
    }
    if (local_120 == (ON_Extrusion *)0x0) {
      return false;
    }
  }
  if ((this->m_bTransposed ^ 1) == dir) {
    ON_Line::ON_Line(&local_c8);
    ON_Line::ON_Line(&local_108);
    ON_Interval::ON_Interval(&local_58);
    ON_Interval::ON_Interval(&local_68);
    ON_Interval::ON_Interval(&local_78);
    ON_Interval::ON_Interval(&local_88);
    dVar1 = ON_Interval::operator[](&this->m_t,0);
    local_d8 = ON_Interval::operator[](&this->m_t,1);
    x = (1.0 - local_d0) * dVar1 + local_d0 * local_d8;
    bVar3 = ON_IsValid(x);
    bVar2 = false;
    if ((x < local_d8) && (dVar1 < x && bVar3)) {
      ON_Line::PointAt(&local_48,&this->m_path,local_d0);
      local_c8.from.z = (this->m_path).from.z;
      local_c8.from.x = (this->m_path).from.x;
      local_c8.from.y = (this->m_path).from.y;
      local_c8.to.x = local_48.x;
      local_c8.to.y = local_48.y;
      local_c8.to.z = local_48.z;
      local_108.from.x = local_48.x;
      local_108.from.y = local_48.y;
      local_108.from.z = local_48.z;
      local_108.to.x = (this->m_path).to.x;
      local_108.to.y = (this->m_path).to.y;
      local_108.to.z = (this->m_path).to.z;
      pdVar5 = ON_Interval::operator[](&local_98,0);
      ON_Interval::Set(&local_58,*pdVar5,c);
      pdVar5 = ON_Interval::operator[](&local_98,1);
      ON_Interval::Set(&local_68,c,*pdVar5);
      ON_Interval::Set(&local_78,dVar1,x);
      ON_Interval::Set(&local_88,x,local_d8);
      bVar2 = ON_Line::IsValid(&local_c8);
      if ((!bVar2) ||
         (((dVar1 = ON_Line::Length(&local_c8), dVar1 <= 2.3283064365386963e-10 ||
           (bVar2 = ON_Line::IsValid(&local_108), !bVar2)) ||
          (dVar1 = ON_Line::Length(&local_108), dVar1 <= 2.3283064365386963e-10)))) {
        bVar2 = false;
      }
      else {
        if (this_00 == (ON_Extrusion *)0x0) {
          this_00 = (ON_Extrusion *)operator_new(0xd0);
          ON_Extrusion(this_00,this);
        }
        else if (this_00 == this) {
          (*(this_00->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x17])
                    (this_00,1);
        }
        else {
          operator=(this_00,this);
        }
        if (local_120 == (ON_Extrusion *)0x0) {
          local_120 = (ON_Extrusion *)operator_new(0xd0);
          ON_Extrusion(local_120,this);
        }
        else if (local_120 == this) {
          (*(local_120->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x17])
                    (local_120,1);
        }
        else {
          operator=(local_120,this);
        }
        (this_00->m_path).to.y = local_c8.to.y;
        (this_00->m_path).to.z = local_c8.to.z;
        (this_00->m_path).from.z = local_c8.from.z;
        (this_00->m_path).to.x = local_c8.to.x;
        (this_00->m_path).from.x = local_c8.from.x;
        (this_00->m_path).from.y = local_c8.from.y;
        (this_00->m_path_domain).m_t[0] = local_58.m_t[0];
        (this_00->m_path_domain).m_t[1] = local_58.m_t[1];
        (this_00->m_t).m_t[0] = local_78.m_t[0];
        (this_00->m_t).m_t[1] = local_78.m_t[1];
        (local_120->m_path).to.y = local_108.to.y;
        (local_120->m_path).to.z = local_108.to.z;
        (local_120->m_path).from.z = local_108.from.z;
        (local_120->m_path).to.x = local_108.to.x;
        (local_120->m_path).from.x = local_108.from.x;
        (local_120->m_path).from.y = local_108.from.y;
        (local_120->m_path_domain).m_t[0] = local_68.m_t[0];
        (local_120->m_path_domain).m_t[1] = local_68.m_t[1];
        (local_120->m_t).m_t[0] = local_88.m_t[0];
        (local_120->m_t).m_t[1] = local_88.m_t[1];
        *west_or_south_side = &this_00->super_ON_Surface;
        *east_or_north_side = &local_120->super_ON_Surface;
        bVar2 = true;
      }
    }
    ON_Line::~ON_Line(&local_108);
    ON_Line::~ON_Line(&local_c8);
    goto LAB_003cedeb;
  }
  if (this->m_profile == (ON_Curve *)0x0) {
    return false;
  }
  local_c8.from.x = 0.0;
  local_108.from.x = 0.0;
  if (this_00 == this) {
    local_c8.from.x = (double)this_00->m_profile;
    (*(this_00->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x17])
              (uVar7,this_00,1);
  }
  else if ((this_00 != (ON_Extrusion *)0x0) && (this_00->m_profile != (ON_Curve *)0x0)) {
    (*(this_00->m_profile->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])();
    this_00->m_profile = (ON_Curve *)0x0;
  }
  if (local_120 == this) {
    local_108.from.x = (double)local_120->m_profile;
    (*(local_120->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x17])
              (uVar7,local_120,1);
  }
  else if ((local_120 != (ON_Extrusion *)0x0) && (local_120->m_profile != (ON_Curve *)0x0)) {
    (*(local_120->m_profile->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])();
    local_120->m_profile = (ON_Curve *)0x0;
  }
  iVar4 = (*(this->m_profile->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x3e])
                    (uVar7,this->m_profile,&local_c8,&local_108);
  if ((char)iVar4 != '\0') {
    pOVar6 = this->m_profile;
    if ((ON_Curve *)local_108.from.x != (ON_Curve *)0x0 &&
        (ON_Curve *)local_c8.from.x != (ON_Curve *)0x0) {
      if ((ON_Curve *)local_108.from.x == pOVar6 || (ON_Curve *)local_c8.from.x == pOVar6) {
LAB_003ced5a:
        pOVar6 = (ON_Curve *)0x0;
      }
      else if (this_00 == this || local_120 == this) {
        if (pOVar6 != (ON_Curve *)0x0) {
          (*(pOVar6->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])(pOVar6);
        }
        goto LAB_003ced5a;
      }
      this->m_profile = (ON_Curve *)0x0;
      if (this_00 == (ON_Extrusion *)0x0) {
        this_00 = (ON_Extrusion *)operator_new(0xd0);
        ON_Extrusion(this_00,this);
      }
      else if (this_00 != this) {
        operator=(this_00,this);
      }
      if (local_120 == (ON_Extrusion *)0x0) {
        local_120 = (ON_Extrusion *)operator_new(0xd0);
        ON_Extrusion(local_120,this);
      }
      else if (local_120 != this) {
        operator=(local_120,this);
      }
      this->m_profile = pOVar6;
      this_00->m_profile = (ON_Curve *)local_c8.from.x;
      local_120->m_profile = (ON_Curve *)local_108.from.x;
      *west_or_south_side = &this_00->super_ON_Surface;
      *east_or_north_side = &local_120->super_ON_Surface;
      bVar2 = true;
      goto LAB_003cedeb;
    }
    if (pOVar6 != (ON_Curve *)local_c8.from.x && (ON_Curve *)local_c8.from.x != (ON_Curve *)0x0) {
      (*(((ON_Geometry *)local_c8.from.x)->super_ON_Object)._vptr_ON_Object[4])();
    }
    bVar2 = false;
    if (((ON_Curve *)local_108.from.x == (ON_Curve *)0x0) ||
       (this->m_profile == (ON_Curve *)local_108.from.x)) goto LAB_003cedeb;
    (*(((ON_Geometry *)local_108.from.x)->super_ON_Object)._vptr_ON_Object[4])();
  }
  bVar2 = false;
LAB_003cedeb:
  if (bVar2 == false) {
    return false;
  }
  return bVar2;
}

Assistant:

bool ON_Extrusion::Split(
       int dir,
       double c,
       ON_Surface*& west_or_south_side,
       ON_Surface*& east_or_north_side
       ) const
{
  if ( dir < 0 || dir > 1 || !ON_IsValid(c) )
    return false;
  if ( 0 != west_or_south_side && west_or_south_side == east_or_north_side )
    return false;

  ON_Interval domain = Domain(dir);
  double s = domain.NormalizedParameterAt(c);
  if ( s <= 0.0 || s >= 1.0 )
    return false;
  if (c <= domain[0] || c >= domain[1] )
    return false;

  ON_Extrusion* left = 0;
  ON_Extrusion* right = 0;
  if ( west_or_south_side )
  {
    left = ON_Extrusion::Cast(west_or_south_side);
    if ( !left )
      return false;
  }
  if ( east_or_north_side )
  {
    right = ON_Extrusion::Cast(east_or_north_side);
    if ( !right )
      return false;
  }

  const int path_dir = PathParameter();
  bool rc = false;
  if ( dir == path_dir )
  {
    // split path
    ON_Line left_path, right_path;
    ON_Interval left_domain, right_domain;
    ON_Interval left_t, right_t;

    const double t0 = m_t[0];
    const double t1 = m_t[1];
    const double t = (1.0-s)*t0 + s*t1;
    if ( !ON_IsValid(t) || t <= t0 || t >= t1 )
      return false;

    ON_3dPoint P = m_path.PointAt(s);
    left_path.from = m_path.from;
    left_path.to = P;
    right_path.from = P;
    right_path.to = m_path.to;
    left_domain.Set(domain[0],c);
    right_domain.Set(c,domain[1]);
    left_t.Set(t0,t);
    right_t.Set(t,t1);
    if ( !left_path.IsValid() || left_path.Length() <= m_path_length_min )
      return false;
    if ( !right_path.IsValid() || right_path.Length() <= m_path_length_min )
      return false;

    // return result
    if ( !left )
      left = new ON_Extrusion(*this);
    else if ( left != this )
      left->operator =(*this);
    else
      left->DestroyRuntimeCache();
    if ( !right )
      right = new ON_Extrusion(*this);
    else if ( right != this )
      right->operator =(*this);
    else
      right->DestroyRuntimeCache();
    left->m_path = left_path;
    left->m_path_domain = left_domain;
    left->m_t = left_t;
    right->m_path = right_path;
    right->m_path_domain = right_domain;
    right->m_t = right_t;

    west_or_south_side = left;
    east_or_north_side = right;
    rc = true;
  }
  else
  {
    if ( 0 == m_profile )
      return false;
    ON_Curve* left_profile = 0;
    ON_Curve* right_profile = 0;

    if ( left == this )
    {
      left_profile = left->m_profile;
      left->DestroyRuntimeCache();
    }
    else if ( 0 != left && 0 != left->m_profile )
    {
      delete left->m_profile;
      left->m_profile = 0;
    }

    if ( right == this )
    {
      right_profile = right->m_profile;
      right->DestroyRuntimeCache();
    }
    else if ( 0 != right && 0 != right->m_profile )
    {
      delete right->m_profile;
      right->m_profile = 0;
    }

    if ( !m_profile->Split(c,left_profile,right_profile) )
      return false;
    if ( 0 == left_profile || 0 == right_profile )
    {
      if ( 0 != left_profile && m_profile != left_profile )
        delete left_profile;
      if ( 0 != right_profile && m_profile != right_profile )
        delete right_profile;
      return false;
    }

    ON_Curve* this_profile = 0;
    if ( left_profile != m_profile && right_profile != m_profile )
    {
      if ( left == this || right == this )
      {
        delete m_profile;
      }
      else
      {
        this_profile = m_profile;
      }
    }

    // Prevent this m_profile from being copied
    const_cast<ON_Extrusion*>(this)->m_profile = 0;

    // Create new left and right sides with nullptr profiles
    if ( !left )
      left = new ON_Extrusion(*this);
    else if ( left != this )
      left->operator =(*this);
    if ( !right )
      right = new ON_Extrusion(*this);
    else if ( right != this )
      right->operator =(*this);

    // Restore this m_profile
    const_cast<ON_Extrusion*>(this)->m_profile = this_profile;

    // Set left and right profiles
    left->m_profile = left_profile;
    right->m_profile = right_profile;

    west_or_south_side = left;
    east_or_north_side = right;
    rc = true;
  }

  return rc;
}